

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gls::BuiltinPrecisionTests::InputLess<tcu::Matrix<float,_3,_2>_>::operator()
          (InputLess<tcu::Matrix<float,_3,_2>_> *this,Matrix<float,_3,_2> *mat1,
          Matrix<float,_3,_2> *mat2)

{
  Vector<float,_3> *vec1;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  Vector<float,_3> *vec2;
  bool bVar5;
  InputLess<tcu::Vector<float,_3>_> local_32;
  InputLess<tcu::Vector<float,_3>_> local_31;
  
  bVar5 = false;
  lVar4 = 0;
  do {
    vec1 = (mat1->m_data).m_data + lVar4;
    vec2 = (mat2->m_data).m_data + lVar4;
    bVar2 = InputLess<tcu::Vector<float,_3>_>::operator()(&local_32,vec1,vec2);
    if (bVar2) {
      bVar3 = true;
      break;
    }
    bVar3 = InputLess<tcu::Vector<float,_3>_>::operator()(&local_31,vec2,vec1);
    lVar4 = 1;
    bVar1 = !bVar5;
    bVar5 = true;
  } while (bVar1 && !bVar3);
  return (bool)(bVar3 & bVar2);
}

Assistant:

bool operator() (const Matrix<T, Rows, Cols>& mat1,
					 const Matrix<T, Rows, Cols>& mat2) const
	{
		for (int col = 0; col < Cols; ++col)
		{
			if (inputLess(mat1[col], mat2[col]))
				return true;
			if (inputLess(mat2[col], mat1[col]))
				return false;
		}

		return false;
	}